

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  OfType OVar2;
  char *pcVar3;
  string *passOrFail;
  long in_RDI;
  string *in_stack_fffffffffffffcd8;
  allocator *paVar4;
  AssertionResult *in_stack_fffffffffffffce0;
  AssertionPrinter *this_00;
  char *in_stack_fffffffffffffce8;
  AssertionPrinter *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  Code colour;
  AssertionPrinter *in_stack_fffffffffffffd20;
  AssertionPrinter *in_stack_fffffffffffffd30;
  allocator local_271;
  string local_270 [28];
  Code in_stack_fffffffffffffdac;
  AssertionPrinter *in_stack_fffffffffffffdb0;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  MessageInfo *local_18;
  undefined8 local_10;
  
  colour = (Code)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  printSourceInfo(in_stack_fffffffffffffd30);
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_fffffffffffffcd8);
  __gnu_cxx::
  __normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
  ::__normal_iterator<Catch::MessageInfo*>
            ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffce0,
             (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffcd8);
  *(undefined8 *)(in_RDI + 0x30) = local_10;
  OVar2 = AssertionResult::getResultType(*(AssertionResult **)(in_RDI + 0x10));
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      pcVar3 = passedString();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar3,&local_39);
      printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      printOriginalExpression(in_stack_fffffffffffffd20);
      printReconstructedExpression(in_stack_fffffffffffffd20);
      bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1edb33);
      if (!bVar1) {
        printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        return;
      }
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      return;
    }
    if (OVar2 == Info) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"info",&local_1d1);
      printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      printMessage(in_stack_fffffffffffffcf0);
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      return;
    }
    if (OVar2 == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"warning",&local_1f9);
      printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      printMessage(in_stack_fffffffffffffcf0);
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(in_stack_fffffffffffffce0);
        if (bVar1) {
          failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90," - but was ok",&local_91);
          std::operator+(in_stack_fffffffffffffce8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffce0);
          printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        else {
          pcVar3 = failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,pcVar3,&local_b9);
          printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        }
        printOriginalExpression(in_stack_fffffffffffffd20);
        printReconstructedExpression(in_stack_fffffffffffffd20);
        dimColour();
        printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        pcVar3 = failedString();
        paVar4 = &local_221;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,pcVar3,paVar4);
        printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        this_00 = (AssertionPrinter *)&stack0xfffffffffffffdb7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"explicitly",(allocator *)this_00);
        printIssue(this_00,in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
        printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          pcVar3 = failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,pcVar3,&local_e1);
          printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"unexpected exception with message:",&local_109);
          printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
          printMessage(in_stack_fffffffffffffcf0);
          printExpressionWas(in_stack_fffffffffffffcf0);
          dimColour();
          printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          pcVar3 = failedString();
          paVar4 = &local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,pcVar3,paVar4);
          printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
          paVar4 = &local_159;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_158,"fatal error condition with message:",paVar4);
          printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string(local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          printMessage(in_stack_fffffffffffffcf0);
          printExpressionWas(in_stack_fffffffffffffcf0);
          dimColour();
          printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          return;
        }
        passOrFail = (string *)failedString();
        paVar4 = &local_181;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,(char *)passOrFail,paVar4);
        printResultType(in_stack_fffffffffffffd20,(Code)((ulong)paVar4 >> 0x20),passOrFail);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,"expected exception, got none",&local_1a9);
        printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        printExpressionWas(in_stack_fffffffffffffcf0);
        dimColour();
        printRemainingMessages(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        return;
      }
    }
  }
  paVar4 = &local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"** internal error **",paVar4);
  printResultType(in_stack_fffffffffffffd20,colour,in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }